

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O3

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
OpenMD::FragmentStamp::getJointAtoms
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,FragmentStamp *this,int rb1,int rb2)

{
  pointer ppRVar1;
  RigidBodyStamp *pRVar2;
  RigidBodyStamp *pRVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  pair<int,_int> pVar8;
  ulong uVar9;
  ulong uVar10;
  pair<int,_int> pVar11;
  pair<int,_int> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppRVar1 = (this->rigidBodyStamps_).
            super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pRVar2 = ppRVar1[rb1];
  uVar7 = (ulong)((long)*(pointer *)
                         ((long)&(pRVar2->members_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + 8) -
                 *(long *)&(pRVar2->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data) >> 2;
  if (0 < (int)uVar7) {
    pRVar3 = ppRVar1[rb2];
    uVar10 = (ulong)((long)*(pointer *)
                            ((long)&(pRVar3->members_).super__Vector_base<int,_std::allocator<int>_>
                                    ._M_impl + 8) -
                    *(long *)&(pRVar3->members_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data) >> 2;
    pVar11.first = 0;
    pVar11.second = 0;
    do {
      lVar4 = *(long *)&(pRVar2->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&(pRVar2->members_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + 8) - lVar4 >> 2) <= (ulong)pVar11) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   pVar11);
      }
      if (0 < (int)uVar10) {
        lVar5 = *(long *)&(pRVar3->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        uVar6 = (long)*(pointer *)
                       ((long)&(pRVar3->members_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - lVar5 >> 2;
        uVar9 = 0;
        pVar8 = pVar11;
        do {
          if (uVar6 == uVar9) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar6);
          }
          if (*(int *)(lVar4 + (long)pVar11 * 4) == *(int *)(lVar5 + uVar9 * 4)) {
            local_38 = pVar8;
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                       __return_storage_ptr__,&local_38);
            break;
          }
          uVar9 = uVar9 + 1;
          pVar8 = (pair<int,_int>)((long)pVar8 + 0x100000000);
        } while ((uVar10 & 0x7fffffff) != uVar9);
      }
      pVar11 = (pair<int,_int>)((long)pVar11 + 1);
    } while (pVar11 != (pair<int,_int>)(uVar7 & 0x7fffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

bool FragmentStamp::addBendStamp(BendStamp* bend) {
    bendStamps_.push_back(bend);
    return true;
  }